

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O0

void __thiscall QIconEngine::virtual_hook(QIconEngine *this,int id,void *data)

{
  QPixmap *in_RDX;
  int in_ESI;
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  ScaledPixmapArgument *arg;
  QSize local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 4) {
    local_28 = ::operator*((QSize *)in_RDX,(qreal)in_RDX);
    (*(in_RDI->super_QPaintDevice)._vptr_QPaintDevice[4])
              (local_20,in_RDI,&local_28,(ulong)*(uint *)&(in_RDX->super_QPaintDevice).painters,
               (ulong)*(uint *)&(in_RDX->super_QPaintDevice).field_0xc);
    QPixmap::operator=(in_RDX,in_RDI);
    QPixmap::~QPixmap(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconEngine::virtual_hook(int id, void *data)
{
    switch (id) {
    case QIconEngine::ScaledPixmapHook: {
        QIconEngine::ScaledPixmapArgument &arg =
            *reinterpret_cast<QIconEngine::ScaledPixmapArgument*>(data);
        // try to get a pixmap with the correct size, the dpr is adjusted later on
        arg.pixmap = pixmap(arg.size * arg.scale, arg.mode, arg.state);
        break;
    }
    default:
        break;
    }
}